

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

bool __thiscall xLearn::Model::Deserialize(Model *this,string *filename)

{
  FILE *file_ptr;
  ostream *poVar1;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (filename->_M_string_length != 0) {
    file_ptr = OpenFileOrDie((filename->_M_dataplus)._M_p,"r");
    if (file_ptr != (FILE *)0x0) {
      ReadStringFromFile(file_ptr,&this->score_func_);
      ReadStringFromFile(file_ptr,&this->loss_func_);
      ReadDataFromDisk(file_ptr,(char *)&this->num_feat_,4);
      ReadDataFromDisk(file_ptr,(char *)&this->num_field_,4);
      ReadDataFromDisk(file_ptr,(char *)&this->num_K_,4);
      ReadDataFromDisk(file_ptr,(char *)&this->aux_size_,4);
      deserialize_w_v_b(this,file_ptr);
      Close(file_ptr);
    }
    return file_ptr != (FILE *)0x0;
  }
  local_5c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
             ,&local_5d);
  std::__cxx11::string::string((string *)&local_58,"Deserialize",&local_5e);
  poVar1 = Logger::Start(ERR,&local_38,300,&local_58);
  poVar1 = std::operator<<(poVar1,"CHECK_NE failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,300);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"filename.empty()");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"true");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

bool Model::Deserialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename.c_str(), "rb");
#endif
  if (file == NULL) { return false; }
  // Read score function
  ReadStringFromFile(file, score_func_);
  // Read loss function
  ReadStringFromFile(file, loss_func_);
  // Read feature num
  ReadDataFromDisk(file, (char*)&num_feat_, sizeof(num_feat_));
  // Read field num
  ReadDataFromDisk(file, (char*)&num_field_, sizeof(num_field_));
  // Read K
  ReadDataFromDisk(file, (char*)&num_K_, sizeof(num_K_));
  // Read aux_size
  ReadDataFromDisk(file, (char*)&aux_size_, sizeof(aux_size_));
  // Read w
  this->deserialize_w_v_b(file);
  Close(file);
  return true;
}